

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.cpp
# Opt level: O1

void __thiscall
QStyleOptionToolButton::QStyleOptionToolButton(QStyleOptionToolButton *this,int version)

{
  QStyleOption::QStyleOption((QStyleOption *)this,version,0xf0003);
  (this->super_QStyleOptionComplex).subControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0xffffffff;
  (this->super_QStyleOptionComplex).activeSubControls =
       (QFlagsStorageHelper<QStyle::SubControl,_4>)0x0;
  (this->features).super_QFlagsStorageHelper<QStyleOptionToolButton::ToolButtonFeature,_4>.
  super_QFlagsStorage<QStyleOptionToolButton::ToolButtonFeature>.i = 0;
  QIcon::QIcon(&this->icon);
  (this->iconSize).wd = -1;
  (this->iconSize).ht = -1;
  (this->text).d.d = (Data *)0x0;
  (this->text).d.ptr = (char16_t *)0x0;
  (this->text).d.size = 0;
  this->arrowType = DownArrow;
  this->toolButtonStyle = ToolButtonIconOnly;
  (this->pos).xp = 0;
  (this->pos).yp = 0;
  QFont::QFont(&this->font);
  return;
}

Assistant:

QStyleOptionToolButton::QStyleOptionToolButton(int version)
    : QStyleOptionComplex(version, SO_ToolButton), features(None), arrowType(Qt::DownArrow)
    , toolButtonStyle(Qt::ToolButtonIconOnly)

{
}